

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  undefined8 in_RCX;
  uint32_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  VP8LStreaks *stats_00;
  double dVar1;
  VP8LStreaks stats;
  VP8LBitEntropy bit_entropy;
  bool local_55;
  uint32_t local_54;
  VP8LStreaks local_50;
  VP8LBitEntropy local_38;
  undefined8 local_20;
  uint32_t *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  (*VP8LGetEntropyUnrefined)(in_RDI,in_ESI,&local_38,&local_50);
  if (local_18 != (uint32_t *)0x0) {
    if (local_38.nonzeros == 1) {
      local_54 = local_38.nonzero_code;
    }
    else {
      local_54 = 0xffffffff;
    }
    *local_18 = local_54;
  }
  local_55 = local_50.streaks[1][0] != 0 || local_50.streaks[1][1] != 0;
  *(bool *)local_20 = local_55;
  stats_00 = (VP8LStreaks *)BitsEntropyRefine(&local_38);
  dVar1 = FinalHuffmanCost(stats_00);
  return (double)stats_00 + dVar1;
}

Assistant:

static double PopulationCost(const uint32_t* const population, int length,
                             uint32_t* const trivial_sym,
                             uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}